

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_indexOf(Context *context,IntrinsicResult partialResult)

{
  int32_t iVar1;
  long lVar2;
  Value *lhs;
  unsigned_long uVar3;
  long lVar4;
  bool bVar6;
  double dVar7;
  ValueList list;
  Value after;
  Value self;
  Value value;
  ValueDictIterator kv;
  Value local_a0;
  String local_90;
  String local_80;
  Value local_70;
  anon_union_8_3_2f476f46_for_data local_60;
  Machine *local_58;
  anon_union_8_3_2f476f46_for_data local_50;
  ListStorage<MiniScript::Context_*> *local_48;
  String local_40;
  unsigned_long uVar5;
  
  String::String(&local_40,"self");
  Context::GetVar((Context *)&self,(String *)partialResult.rs,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  String::String(&local_80,"value");
  Context::GetVar((Context *)&value,(String *)partialResult.rs,(LocalOnlyMode)&local_80);
  String::~String(&local_80);
  String::String(&local_90,"after");
  Context::GetVar((Context *)&after,(String *)partialResult.rs,(LocalOnlyMode)&local_90);
  String::~String(&local_90);
  if (self.type == String) {
    Value::GetString((Value *)&list);
    Value::ToString((Value *)&kv,(Machine *)&value);
    if (after.type == Null) {
      lVar4 = -1;
    }
    else {
      iVar1 = Value::IntValue(&after);
      lVar4 = (long)iVar1;
      if (iVar1 < -1) {
        lVar2 = String::Length((String *)&list);
        lVar4 = lVar4 + lVar2;
      }
    }
    lVar4 = String::IndexOf((String *)&list,(String *)&kv,lVar4 + 1);
    if (-1 < lVar4) {
      local_58 = (Machine *)(double)lVar4;
      local_60.tempNum._0_2_ = 1;
      local_60.tempNum._2_1_ = 0;
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,(Value *)&local_60,true);
      Value::~Value((Value *)&local_60);
      String::~String((String *)&kv);
      String::~String((String *)&list);
      goto LAB_00121c55;
    }
    String::~String((String *)&kv);
    String::~String((String *)&list);
  }
  else if (self.type == Map) {
    Value::GetDict((ValueDict *)&list,&self);
    bVar6 = after.type == Null;
    DictIterator<MiniScript::Value,_MiniScript::Value>::DictIterator
              (&kv,(DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)list._8_8_);
    while (kv.entry != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
      if (bVar6) {
        Value::Value(&local_70,&(kv.entry)->value);
        dVar7 = Value::Equality(&local_70,&value,0x10);
        Value::~Value(&local_70);
        bVar6 = true;
        if ((dVar7 == 1.0) && (!NAN(dVar7))) {
          Value::Value(&local_a0,&(kv.entry)->key);
          IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_a0,true);
          Value::~Value(&local_a0);
          Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
                    ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                     &list);
          goto LAB_00121c55;
        }
      }
      else {
        Value::Value(&local_70,&(kv.entry)->key);
        dVar7 = Value::Equality(&local_70,&after,0x10);
        Value::~Value(&local_70);
        if ((dVar7 != 1.0) || (NAN(dVar7))) {
          bVar6 = false;
        }
        else {
          bVar6 = true;
        }
      }
      DictIterator<MiniScript::Value,_MiniScript::Value>::Next(&kv);
    }
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&list);
  }
  else if (self.type == List) {
    Value::GetList((Value *)&list);
    if (list.ls == (ListStorage<MiniScript::Value> *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = ((list.ls)->super_SimpleVector<MiniScript::Value>).mQtyItems;
    }
    if (after.type == Null) {
      lVar4 = -1;
    }
    else {
      iVar1 = Value::IntValue(&after);
      uVar5 = 0;
      if (iVar1 < -1) {
        uVar5 = uVar3;
      }
      lVar4 = uVar5 + (long)iVar1;
    }
    if ((lVar4 < -1) || ((long)uVar3 <= lVar4)) {
      IntrinsicResult::IntrinsicResult
                ((IntrinsicResult *)context,(IntrinsicResult *)&IntrinsicResult::Null);
    }
    else {
      do {
        lVar4 = lVar4 + 1;
        if ((long)uVar3 <= lVar4) {
          List<MiniScript::Value>::release(&list);
          goto LAB_00121c46;
        }
        lhs = List<MiniScript::Value>::operator[](&list,lVar4);
        dVar7 = Value::Equality(lhs,&value,0x10);
      } while ((dVar7 != 1.0) || (NAN(dVar7)));
      local_48 = (ListStorage<MiniScript::Context_*> *)(double)lVar4;
      local_50.tempNum._0_2_ = 1;
      local_50.tempNum._2_1_ = 0;
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,(Value *)&local_50,true);
      Value::~Value((Value *)&local_50);
    }
    List<MiniScript::Value>::release(&list);
    goto LAB_00121c55;
  }
LAB_00121c46:
  IntrinsicResult::IntrinsicResult
            ((IntrinsicResult *)context,(IntrinsicResult *)&IntrinsicResult::Null);
LAB_00121c55:
  Value::~Value(&after);
  Value::~Value(&value);
  Value::~Value(&self);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_indexOf(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value value = context->GetVar("value");
		Value after = context->GetVar("after");
		if (self.type == ValueType::List) {
			ValueList list = self.GetList();
			long count = list.Count();
			long afterIdx = -1;
			if (!after.IsNull()) afterIdx = after.IntValue();
			if (afterIdx < -1) afterIdx += count;
			if (afterIdx < -1 || afterIdx > count-1) return IntrinsicResult::Null;
			for (long i=afterIdx+1; i<count; i++) {
				if (Value::Equality(list[i], value) == 1) return IntrinsicResult(i);
			}
		} else if (self.type == ValueType::String) {
			String str = self.GetString();
			String s = value.ToString();
			long afterIdx = -1;
			if (!after.IsNull()) afterIdx = after.IntValue();
			if (afterIdx < -1) afterIdx += str.Length();
			long idx = str.IndexOf(s, afterIdx+1);
			if (idx >= 0) return IntrinsicResult(idx);
		} else if (self.type == ValueType::Map) {
			ValueDict dict = self.GetDict();
			bool sawAfter = after.IsNull();
			for (ValueDictIterator kv = dict.GetIterator(); !kv.Done(); kv.Next()) {
				if (!sawAfter) {
					if (Value::Equality(kv.Key(), after) == 1) sawAfter = true;
				} else {
					if (Value::Equality(kv.Value(), value) == 1) return IntrinsicResult(kv.Key());
    			}
			}
		}
		return IntrinsicResult::Null;
	}